

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O3

void __thiscall FIX::HttpConnection::HttpConnection(HttpConnection *this,socket_handle s)

{
  __fd_mask *p_Var1;
  int iVar2;
  
  this->m_socket = s;
  (this->m_parser).m_buffer._M_dataplus._M_p = (pointer)&(this->m_parser).m_buffer.field_2;
  (this->m_parser).m_buffer._M_string_length = 0;
  (this->m_parser).m_buffer.field_2._M_local_buf[0] = '\0';
  (this->m_fds).fds_bits[0] = 0;
  (this->m_fds).fds_bits[1] = 0;
  (this->m_fds).fds_bits[2] = 0;
  (this->m_fds).fds_bits[3] = 0;
  (this->m_fds).fds_bits[4] = 0;
  (this->m_fds).fds_bits[5] = 0;
  (this->m_fds).fds_bits[6] = 0;
  (this->m_fds).fds_bits[7] = 0;
  (this->m_fds).fds_bits[8] = 0;
  (this->m_fds).fds_bits[9] = 0;
  (this->m_fds).fds_bits[10] = 0;
  (this->m_fds).fds_bits[0xb] = 0;
  (this->m_fds).fds_bits[0xc] = 0;
  (this->m_fds).fds_bits[0xd] = 0;
  (this->m_fds).fds_bits[0xe] = 0;
  (this->m_fds).fds_bits[0xf] = 0;
  iVar2 = s + 0x3f;
  if (-1 < s) {
    iVar2 = s;
  }
  p_Var1 = (this->m_fds).fds_bits + (iVar2 >> 6);
  *p_Var1 = *p_Var1 | 1L << ((byte)s & 0x3f);
  return;
}

Assistant:

HttpConnection::HttpConnection(socket_handle s )
: m_socket( s )
{
  FD_ZERO( &m_fds );
  FD_SET( m_socket, &m_fds );
}